

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O2

void Cec_ManPatStore(Cec_ManPat_t *p,Vec_Int_t *vPat)

{
  uint __line;
  int Num;
  int iVar1;
  int i;
  char *__assertion;
  
  if (vPat->nSize < 1) {
    __assertion = "Vec_IntSize(vPat) > 0";
    __line = 0x5a;
  }
  else {
    Cec_ManPatStoreNum(p,vPat->nSize);
    Num = Vec_IntEntry(vPat,0);
    Cec_ManPatStoreNum(p,Num);
    i = 1;
    while( true ) {
      if (vPat->nSize <= i) {
        return;
      }
      iVar1 = Vec_IntEntry(vPat,i);
      if (iVar1 - Num == 0 || iVar1 < Num) break;
      Cec_ManPatStoreNum(p,iVar1 - Num);
      i = i + 1;
      Num = iVar1;
    }
    __assertion = "NumberPrev < Number";
    __line = 0x60;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecPat.c"
                ,__line,"void Cec_ManPatStore(Cec_ManPat_t *, Vec_Int_t *)");
}

Assistant:

static inline void Cec_ManPatStore( Cec_ManPat_t * p, Vec_Int_t * vPat )
{
    int i, Number, NumberPrev;
    assert( Vec_IntSize(vPat) > 0 );
    Cec_ManPatStoreNum( p, Vec_IntSize(vPat) );
    NumberPrev = Vec_IntEntry( vPat, 0 );
    Cec_ManPatStoreNum( p, NumberPrev );
    Vec_IntForEachEntryStart( vPat, Number, i, 1 )
    {
        assert( NumberPrev < Number );
        Cec_ManPatStoreNum( p, Number - NumberPrev );
        NumberPrev = Number;
    }
}